

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O3

void __thiscall dbwrapper_tests::dbwrapper::test_method(dbwrapper *this)

{
  byte bVar1;
  long lVar2;
  pointer puVar3;
  pointer puVar4;
  byte bVar5;
  int iVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  long in_FS_OFFSET;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar13;
  undefined1 local_2f0 [16];
  undefined1 *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  uint8_t key;
  string *local_218;
  assertion_result local_210;
  string **local_1f8;
  string *local_1f0;
  char *local_1e8;
  char *local_1e0;
  assertion_result local_1d8;
  byte local_1ba [2];
  string local_1b8;
  string local_198;
  uint256 res;
  uint256 in;
  undefined1 local_130 [40];
  size_t local_108;
  undefined2 local_100;
  bool local_fe;
  DBOptions local_fd;
  CDBWrapper dbw;
  path local_88;
  path ph;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_1ba[0] = 0;
  local_1ba[1] = 1;
  lVar8 = 0;
  do {
    bVar1 = local_1ba[lVar8];
    ArgsManager::GetDataDir
              ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
    pcVar9 = "dbwrapper_obfuscate_false";
    if (bVar1 != 0) {
      pcVar9 = "dbwrapper_obfuscate_true";
    }
    std::filesystem::__cxx11::path::_M_append(&local_88,bVar1 ^ 0x19,pcVar9);
    std::filesystem::__cxx11::path::path(&ph.super_path,&local_88);
    std::filesystem::__cxx11::path::~path(&local_88);
    std::filesystem::__cxx11::path::path((path *)local_130,&ph.super_path);
    local_108 = 0x100000;
    local_100._0_1_ = true;
    local_100._1_1_ = false;
    local_fd.force_compact = false;
    local_fe = (bool)bVar1;
    CDBWrapper::CDBWrapper(&dbw,(DBParams *)local_130);
    std::filesystem::__cxx11::path::~path((path *)local_130);
    key = 'k';
    in.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    in.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    output.m_size = 0x20;
    output.m_data = (byte *)&in;
    FastRandomContext::fillrand(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng,output);
    res.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    res.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_230 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_228 = "";
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = &DAT_00000028;
    file.m_begin = (iterator)&local_230;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_240,msg);
    _cVar13 = 0x37700d;
    pvVar7 = dbwrapper_private::GetObfuscateKey(&dbw);
    puVar3 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (pvVar7->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar5 = 1;
    if (puVar4 != puVar3) {
      uVar10 = 0;
      do {
        bVar5 = bVar5 & puVar3[uVar10] == '\0';
        uVar10 = uVar10 + 1;
      } while ((uVar10 & 0xffffffff) < (ulong)((long)puVar4 - (long)puVar3));
    }
    local_210.m_message.px = (element_type *)0x0;
    local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2f0._0_8_ = "obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw))";
    local_2f0._8_8_ = "";
    local_130[8] = 0;
    local_130._0_8_ = &PTR__lazy_ostream_01389048;
    local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_130._24_8_ = local_2f0;
    local_250 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_248 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(bVar1 != bVar5);
    boost::test_tools::tt_detail::report_assertion
              (&local_210,(lazy_ostream *)local_130,1,0,WARN,_cVar13,(size_t)&local_250,0x28);
    boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
    local_260 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_258 = "";
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x2a;
    file_00.m_begin = (iterator)&local_260;
    msg_00.m_end = pvVar12;
    msg_00.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_270,
               msg_00);
    _cVar13 = 0x377143;
    local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CDBWrapper::Write<unsigned_char,uint256>(&dbw,&key,&in,false);
    local_210.m_message.px = (element_type *)0x0;
    local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2f0._0_8_ = "dbw.Write(key, in)";
    local_2f0._8_8_ = "";
    local_130[8] = 0;
    local_130._0_8_ = &PTR__lazy_ostream_01389048;
    local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_130._24_8_ = local_2f0;
    local_280 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_278 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_210,(lazy_ostream *)local_130,1,0,WARN,_cVar13,(size_t)&local_280,0x2a);
    boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
    local_290 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_288 = "";
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x2b;
    file_01.m_begin = (iterator)&local_290;
    msg_01.m_end = pvVar12;
    msg_01.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
               msg_01);
    _cVar13 = 0x37724d;
    local_210.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CDBWrapper::Read<unsigned_char,uint256>(&dbw,&key,&res);
    local_210.m_message.px = (element_type *)0x0;
    local_210.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_2f0._0_8_ = "dbw.Read(key, res)";
    local_2f0._8_8_ = "";
    local_130[8] = 0;
    local_130._0_8_ = &PTR__lazy_ostream_01389048;
    local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_130._24_8_ = local_2f0;
    local_2b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_2a8 = "";
    pvVar11 = (iterator)0x1;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_210,(lazy_ostream *)local_130,1,0,WARN,_cVar13,(size_t)&local_2b0,0x2b);
    boost::detail::shared_count::~shared_count(&local_210.m_message.pn);
    local_2c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_2b8 = "";
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x2c;
    file_02.m_begin = (iterator)&local_2c0;
    msg_02.m_end = pvVar12;
    msg_02.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d0,
               msg_02);
    local_2f0._8_8_ = local_2f0._8_8_ & 0xffffffffffffff00;
    local_2f0._0_8_ = &PTR__lazy_ostream_01388f08;
    local_2e0 = boost::unit_test::lazy_ostream::inst;
    local_2d8 = "";
    base_blob<256u>::ToString_abi_cxx11_(&local_198,&res);
    base_blob<256u>::ToString_abi_cxx11_(&local_1b8,&in);
    if (local_198._M_string_length == local_1b8._M_string_length) {
      if (local_198._M_string_length == 0) {
        local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x1;
      }
      else {
        iVar6 = bcmp(local_198._M_dataplus._M_p,local_1b8._M_dataplus._M_p,
                     local_198._M_string_length);
        local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(iVar6 == 0);
      }
    }
    else {
      local_1d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
    }
    local_1d8.m_message.px = (element_type *)0x0;
    local_1d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_1e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_1e0 = "";
    local_1f0 = &local_198;
    local_130[8] = 0;
    local_130._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_130._24_8_ = &local_1f0;
    local_218 = &local_1b8;
    local_210.m_message.px = (element_type *)((ulong)local_210.m_message.px & 0xffffffffffffff00);
    local_210._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_210.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_1f8 = &local_218;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              (&local_1d8,(lazy_ostream *)local_2f0,1,2,REQUIRE,0xe5d479,(size_t)&local_1e8,0x2c,
               (DBParams *)local_130,"in.ToString()",&local_210);
    boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    CDBWrapper::~CDBWrapper(&dbw);
    std::filesystem::__cxx11::path::~path(&ph.super_path);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(dbwrapper)
{
    // Perform tests both obfuscated and non-obfuscated.
    for (const bool obfuscate : {false, true}) {
        fs::path ph = m_args.GetDataDirBase() / (obfuscate ? "dbwrapper_obfuscate_true" : "dbwrapper_obfuscate_false");
        CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = obfuscate});
        uint8_t key{'k'};
        uint256 in = m_rng.rand256();
        uint256 res;

        // Ensure that we're doing real obfuscation when obfuscate=true
        BOOST_CHECK(obfuscate != is_null_key(dbwrapper_private::GetObfuscateKey(dbw)));

        BOOST_CHECK(dbw.Write(key, in));
        BOOST_CHECK(dbw.Read(key, res));
        BOOST_CHECK_EQUAL(res.ToString(), in.ToString());
    }
}